

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::elemidx<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  optional<unsigned_int> oVar1;
  string local_68;
  undefined1 local_48 [8];
  optional<wasm::Name> id;
  allocator<char> local_21;
  
  oVar1 = Lexer::takeU<unsigned_int>(&ctx->in);
  if ((((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) &&
     (Lexer::takeID((optional<wasm::Name> *)local_48,&ctx->in),
     id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
     super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"expected elem index or identifier",&local_21);
    Lexer::err((Err *)local_48,&ctx->in,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::~string((string *)&local_68);
    return __return_storage_ptr__;
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::ElemIdxT> elemidx(Ctx& ctx) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getElemFromIdx(*x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getElemFromName(*id);
  }
  return ctx.in.err("expected elem index or identifier");
}